

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  NodeRef *pNVar30;
  ulong uVar31;
  ulong uVar32;
  undefined4 uVar33;
  ulong unaff_R12;
  size_t mask;
  ulong uVar34;
  uint uVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  float fVar52;
  float fVar53;
  undefined1 auVar45 [16];
  float fVar55;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar54;
  float fVar56;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar65 [16];
  float fVar74;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar75;
  float fVar76;
  float fVar82;
  float fVar85;
  undefined1 auVar77 [16];
  float fVar88;
  undefined1 auVar78 [16];
  float fVar83;
  float fVar86;
  float fVar89;
  undefined1 auVar79 [16];
  float fVar84;
  float fVar87;
  float fVar90;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar91;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar101;
  float fVar112;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar110;
  float fVar111;
  undefined1 auVar109 [32];
  undefined1 auVar114 [16];
  float fVar113;
  float fVar122;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar120;
  float fVar121;
  undefined1 auVar119 [32];
  float fVar123;
  float fVar127;
  float fVar128;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar129;
  undefined1 auVar126 [16];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar144 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 *local_15a8;
  ulong local_15a0;
  ulong local_1598;
  NodeRef *local_1590;
  ulong local_1588;
  ulong local_1580;
  RTCFilterFunctionNArguments args;
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  RTCHitN local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  uint local_1318;
  uint uStack_1314;
  uint uStack_1310;
  uint uStack_130c;
  uint uStack_1308;
  uint uStack_1304;
  uint uStack_1300;
  uint uStack_12fc;
  undefined1 local_12f8 [32];
  int local_12d8;
  int iStack_12d4;
  int iStack_12d0;
  int iStack_12cc;
  int iStack_12c8;
  int iStack_12c4;
  int iStack_12c0;
  int iStack_12bc;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  undefined1 local_1298 [8];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  undefined1 local_1278 [8];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float fStack_1220;
  undefined1 local_1218 [8];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float fStack_1200;
  undefined4 local_11f8;
  undefined4 uStack_11f4;
  undefined4 uStack_11f0;
  undefined4 uStack_11ec;
  undefined4 uStack_11e8;
  undefined4 uStack_11e4;
  undefined4 uStack_11e0;
  undefined4 uStack_11dc;
  NodeRef stack [564];
  
  stack[0] = root;
  uVar33 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar119._4_4_ = uVar33;
  auVar119._0_4_ = uVar33;
  auVar119._8_4_ = uVar33;
  auVar119._12_4_ = uVar33;
  auVar119._16_4_ = uVar33;
  auVar119._20_4_ = uVar33;
  auVar119._24_4_ = uVar33;
  auVar119._28_4_ = uVar33;
  uVar33 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar109._4_4_ = uVar33;
  auVar109._0_4_ = uVar33;
  auVar109._8_4_ = uVar33;
  auVar109._12_4_ = uVar33;
  auVar109._16_4_ = uVar33;
  auVar109._20_4_ = uVar33;
  auVar109._24_4_ = uVar33;
  auVar109._28_4_ = uVar33;
  local_11f8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uStack_11f4 = local_11f8;
  uStack_11f0 = local_11f8;
  uStack_11ec = local_11f8;
  uStack_11e8 = local_11f8;
  uStack_11e4 = local_11f8;
  uStack_11e0 = local_11f8;
  uStack_11dc = local_11f8;
  fVar43 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar52 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar53 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar42 = ZEXT416((uint)(fVar43 * 0.99999964));
  auVar42 = vshufps_avx(auVar42,auVar42,0);
  register0x00001310 = auVar42;
  _local_1218 = auVar42;
  auVar42 = ZEXT416((uint)(fVar52 * 0.99999964));
  auVar42 = vshufps_avx(auVar42,auVar42,0);
  register0x00001310 = auVar42;
  _local_1238 = auVar42;
  auVar42 = ZEXT416((uint)(fVar53 * 0.99999964));
  auVar42 = vshufps_avx(auVar42,auVar42,0);
  register0x000012d0 = auVar42;
  _local_1258 = auVar42;
  auVar42 = ZEXT416((uint)(fVar43 * 1.0000004));
  auVar42 = vshufps_avx(auVar42,auVar42,0);
  register0x00001210 = auVar42;
  _local_1278 = auVar42;
  auVar42 = ZEXT416((uint)(fVar52 * 1.0000004));
  auVar42 = vshufps_avx(auVar42,auVar42,0);
  register0x00001210 = auVar42;
  _local_1298 = auVar42;
  auVar42 = ZEXT416((uint)(fVar53 * 1.0000004));
  auVar42 = vshufps_avx(auVar42,auVar42,0);
  register0x00001210 = auVar42;
  _local_12b8 = auVar42;
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar34 = uVar31 ^ 0x20;
  local_1580 = uVar32 ^ 0x20;
  local_12d8 = (tray->tnear).field_0.i[k];
  iStack_12d4 = local_12d8;
  iStack_12d0 = local_12d8;
  iStack_12cc = local_12d8;
  iStack_12c8 = local_12d8;
  iStack_12c4 = local_12d8;
  iStack_12c0 = local_12d8;
  iStack_12bc = local_12d8;
  iVar1 = (tray->tfar).field_0.i[k];
  local_12f8._4_4_ = iVar1;
  local_12f8._0_4_ = iVar1;
  local_12f8._8_4_ = iVar1;
  local_12f8._12_4_ = iVar1;
  local_12f8._16_4_ = iVar1;
  local_12f8._20_4_ = iVar1;
  local_12f8._24_4_ = iVar1;
  local_12f8._28_4_ = iVar1;
  local_1588 = uVar29 ^ 0x20;
  local_15a8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar30 = stack + 1;
  do {
    local_1590 = pNVar30;
    if (local_1590 == stack) break;
    pNVar30 = local_1590 + -1;
    uVar28 = local_1590[-1].ptr;
    do {
      if ((uVar28 & 8) == 0) {
        auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar28 + 0x40 + uVar31),auVar119);
        auVar11._4_4_ = auVar10._4_4_ * (float)local_1218._4_4_;
        auVar11._0_4_ = auVar10._0_4_ * (float)local_1218._0_4_;
        auVar11._8_4_ = auVar10._8_4_ * fStack_1210;
        auVar11._12_4_ = auVar10._12_4_ * fStack_120c;
        auVar11._16_4_ = auVar10._16_4_ * fStack_1208;
        auVar11._20_4_ = auVar10._20_4_ * fStack_1204;
        auVar11._24_4_ = auVar10._24_4_ * fStack_1200;
        auVar11._28_4_ = auVar10._28_4_;
        auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar28 + 0x40 + uVar32),auVar109);
        auVar12._4_4_ = auVar10._4_4_ * (float)local_1238._4_4_;
        auVar12._0_4_ = auVar10._0_4_ * (float)local_1238._0_4_;
        auVar12._8_4_ = auVar10._8_4_ * fStack_1230;
        auVar12._12_4_ = auVar10._12_4_ * fStack_122c;
        auVar12._16_4_ = auVar10._16_4_ * fStack_1228;
        auVar12._20_4_ = auVar10._20_4_ * fStack_1224;
        auVar12._24_4_ = auVar10._24_4_ * fStack_1220;
        auVar12._28_4_ = auVar10._28_4_;
        auVar10 = vmaxps_avx(auVar11,auVar12);
        auVar23._4_4_ = uStack_11f4;
        auVar23._0_4_ = local_11f8;
        auVar23._8_4_ = uStack_11f0;
        auVar23._12_4_ = uStack_11ec;
        auVar23._16_4_ = uStack_11e8;
        auVar23._20_4_ = uStack_11e4;
        auVar23._24_4_ = uStack_11e0;
        auVar23._28_4_ = uStack_11dc;
        auVar11 = vsubps_avx(*(undefined1 (*) [32])(uVar28 + 0x40 + uVar29),auVar23);
        auVar13._4_4_ = auVar11._4_4_ * (float)local_1258._4_4_;
        auVar13._0_4_ = auVar11._0_4_ * (float)local_1258._0_4_;
        auVar13._8_4_ = auVar11._8_4_ * fStack_1250;
        auVar13._12_4_ = auVar11._12_4_ * fStack_124c;
        auVar13._16_4_ = auVar11._16_4_ * fStack_1248;
        auVar13._20_4_ = auVar11._20_4_ * fStack_1244;
        auVar13._24_4_ = auVar11._24_4_ * fStack_1240;
        auVar13._28_4_ = auVar11._28_4_;
        auVar22._4_4_ = iStack_12d4;
        auVar22._0_4_ = local_12d8;
        auVar22._8_4_ = iStack_12d0;
        auVar22._12_4_ = iStack_12cc;
        auVar22._16_4_ = iStack_12c8;
        auVar22._20_4_ = iStack_12c4;
        auVar22._24_4_ = iStack_12c0;
        auVar22._28_4_ = iStack_12bc;
        auVar11 = vmaxps_avx(auVar13,auVar22);
        auVar10 = vmaxps_avx(auVar10,auVar11);
        auVar11 = vsubps_avx(*(undefined1 (*) [32])(uVar28 + 0x40 + uVar34),auVar119);
        auVar14._4_4_ = auVar11._4_4_ * (float)local_1278._4_4_;
        auVar14._0_4_ = auVar11._0_4_ * (float)local_1278._0_4_;
        auVar14._8_4_ = auVar11._8_4_ * fStack_1270;
        auVar14._12_4_ = auVar11._12_4_ * fStack_126c;
        auVar14._16_4_ = auVar11._16_4_ * fStack_1268;
        auVar14._20_4_ = auVar11._20_4_ * fStack_1264;
        auVar14._24_4_ = auVar11._24_4_ * fStack_1260;
        auVar14._28_4_ = auVar11._28_4_;
        auVar11 = vsubps_avx(*(undefined1 (*) [32])(uVar28 + 0x40 + local_1580),auVar109);
        auVar15._4_4_ = auVar11._4_4_ * (float)local_1298._4_4_;
        auVar15._0_4_ = auVar11._0_4_ * (float)local_1298._0_4_;
        auVar15._8_4_ = auVar11._8_4_ * fStack_1290;
        auVar15._12_4_ = auVar11._12_4_ * fStack_128c;
        auVar15._16_4_ = auVar11._16_4_ * fStack_1288;
        auVar15._20_4_ = auVar11._20_4_ * fStack_1284;
        auVar15._24_4_ = auVar11._24_4_ * fStack_1280;
        auVar15._28_4_ = auVar11._28_4_;
        auVar11 = vminps_avx(auVar14,auVar15);
        auVar12 = vsubps_avx(*(undefined1 (*) [32])(uVar28 + 0x40 + local_1588),auVar23);
        auVar16._4_4_ = auVar12._4_4_ * (float)local_12b8._4_4_;
        auVar16._0_4_ = auVar12._0_4_ * (float)local_12b8._0_4_;
        auVar16._8_4_ = auVar12._8_4_ * fStack_12b0;
        auVar16._12_4_ = auVar12._12_4_ * fStack_12ac;
        auVar16._16_4_ = auVar12._16_4_ * fStack_12a8;
        auVar16._20_4_ = auVar12._20_4_ * fStack_12a4;
        auVar16._24_4_ = auVar12._24_4_ * fStack_12a0;
        auVar16._28_4_ = auVar12._28_4_;
        auVar12 = vminps_avx(auVar16,local_12f8);
        auVar11 = vminps_avx(auVar11,auVar12);
        auVar10 = vcmpps_avx(auVar10,auVar11,2);
        uVar33 = vmovmskps_avx(auVar10);
        unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar33);
      }
      if ((uVar28 & 8) == 0) {
        if (unaff_R12 == 0) {
          uVar35 = 4;
        }
        else {
          uVar27 = uVar28 & 0xfffffffffffffff0;
          lVar26 = 0;
          if (unaff_R12 != 0) {
            for (; (unaff_R12 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
            }
          }
          uVar35 = 0;
          uVar28 = *(ulong *)(uVar27 + lVar26 * 8);
          uVar25 = unaff_R12 - 1 & unaff_R12;
          if (uVar25 != 0) {
            pNVar30->ptr = uVar28;
            lVar26 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
              }
            }
            uVar24 = uVar25 - 1;
            while( true ) {
              pNVar30 = pNVar30 + 1;
              uVar28 = *(ulong *)(uVar27 + lVar26 * 8);
              uVar24 = uVar24 & uVar25;
              if (uVar24 == 0) break;
              pNVar30->ptr = uVar28;
              lVar26 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                }
              }
              uVar25 = uVar24 - 1;
            }
          }
        }
      }
      else {
        uVar35 = 6;
      }
    } while (uVar35 == 0);
    if (uVar35 == 6) {
      uVar35 = 0;
      local_15a0 = (ulong)((uint)uVar28 & 0xf) - 8;
      bVar36 = local_15a0 != 0;
      if (bVar36) {
        uVar28 = uVar28 & 0xfffffffffffffff0;
        local_1598 = 0;
        uVar27 = uVar34;
        do {
          lVar26 = local_1598 * 0xb0;
          uVar33 = *(undefined4 *)(ray + k * 4);
          auVar45._4_4_ = uVar33;
          auVar45._0_4_ = uVar33;
          auVar45._8_4_ = uVar33;
          auVar45._12_4_ = uVar33;
          uVar33 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar57._4_4_ = uVar33;
          auVar57._0_4_ = uVar33;
          auVar57._8_4_ = uVar33;
          auVar57._12_4_ = uVar33;
          uVar33 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar77._4_4_ = uVar33;
          auVar77._0_4_ = uVar33;
          auVar77._8_4_ = uVar33;
          auVar77._12_4_ = uVar33;
          auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + lVar26),auVar45);
          auVar9 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x10 + lVar26),auVar57);
          auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x20 + lVar26),auVar77);
          auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x30 + lVar26),auVar45);
          auVar58 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x40 + lVar26),auVar57);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x50 + lVar26),auVar77);
          auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x60 + lVar26),auVar45);
          auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x70 + lVar26),auVar57);
          auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x80 + lVar26),auVar77);
          auVar65 = vsubps_avx(auVar45,auVar42);
          auVar77 = vsubps_avx(auVar57,auVar9);
          auVar46 = vsubps_avx(auVar66,auVar47);
          fVar64 = auVar9._0_4_;
          fVar43 = fVar64 + auVar57._0_4_;
          fVar71 = auVar9._4_4_;
          fVar52 = fVar71 + auVar57._4_4_;
          fVar72 = auVar9._8_4_;
          fVar53 = fVar72 + auVar57._8_4_;
          fVar73 = auVar9._12_4_;
          fVar55 = fVar73 + auVar57._12_4_;
          fVar143 = auVar47._0_4_;
          fVar75 = fVar143 + auVar66._0_4_;
          fVar145 = auVar47._4_4_;
          fVar82 = fVar145 + auVar66._4_4_;
          fVar146 = auVar47._8_4_;
          fVar85 = fVar146 + auVar66._8_4_;
          fVar147 = auVar47._12_4_;
          fVar88 = fVar147 + auVar66._12_4_;
          fVar44 = auVar46._0_4_;
          auVar114._0_4_ = fVar43 * fVar44;
          fVar54 = auVar46._4_4_;
          auVar114._4_4_ = fVar52 * fVar54;
          fVar56 = auVar46._8_4_;
          auVar114._8_4_ = fVar53 * fVar56;
          fVar8 = auVar46._12_4_;
          auVar114._12_4_ = fVar55 * fVar8;
          fVar148 = auVar77._0_4_;
          auVar124._0_4_ = fVar148 * fVar75;
          fVar149 = auVar77._4_4_;
          auVar124._4_4_ = fVar149 * fVar82;
          fVar150 = auVar77._8_4_;
          auVar124._8_4_ = fVar150 * fVar85;
          fVar151 = auVar77._12_4_;
          auVar124._12_4_ = fVar151 * fVar88;
          auVar77 = vsubps_avx(auVar124,auVar114);
          fVar101 = auVar42._0_4_;
          fVar113 = fVar101 + auVar45._0_4_;
          fVar110 = auVar42._4_4_;
          fVar120 = fVar110 + auVar45._4_4_;
          fVar111 = auVar42._8_4_;
          fVar121 = fVar111 + auVar45._8_4_;
          fVar112 = auVar42._12_4_;
          fVar122 = fVar112 + auVar45._12_4_;
          fVar130 = auVar65._0_4_;
          auVar78._0_4_ = fVar130 * fVar75;
          fVar132 = auVar65._4_4_;
          auVar78._4_4_ = fVar132 * fVar82;
          fVar133 = auVar65._8_4_;
          auVar78._8_4_ = fVar133 * fVar85;
          fVar134 = auVar65._12_4_;
          auVar78._12_4_ = fVar134 * fVar88;
          auVar125._0_4_ = fVar113 * fVar44;
          auVar125._4_4_ = fVar120 * fVar54;
          auVar125._8_4_ = fVar121 * fVar56;
          auVar125._12_4_ = fVar122 * fVar8;
          auVar65 = vsubps_avx(auVar125,auVar78);
          auVar115._0_4_ = fVar113 * fVar148;
          auVar115._4_4_ = fVar120 * fVar149;
          auVar115._8_4_ = fVar121 * fVar150;
          auVar115._12_4_ = fVar122 * fVar151;
          auVar46._0_4_ = fVar130 * fVar43;
          auVar46._4_4_ = fVar132 * fVar52;
          auVar46._8_4_ = fVar133 * fVar53;
          auVar46._12_4_ = fVar134 * fVar55;
          auVar46 = vsubps_avx(auVar46,auVar115);
          fVar43 = *(float *)(ray + k * 4 + 0x60);
          fVar52 = *(float *)(ray + k * 4 + 0x50);
          fVar53 = *(float *)(ray + k * 4 + 0x40);
          auVar131._0_4_ = fVar53 * auVar77._0_4_ + fVar43 * auVar46._0_4_ + fVar52 * auVar65._0_4_;
          auVar131._4_4_ = fVar53 * auVar77._4_4_ + fVar43 * auVar46._4_4_ + fVar52 * auVar65._4_4_;
          auVar131._8_4_ = fVar53 * auVar77._8_4_ + fVar43 * auVar46._8_4_ + fVar52 * auVar65._8_4_;
          auVar131._12_4_ =
               fVar53 * auVar77._12_4_ + fVar43 * auVar46._12_4_ + fVar52 * auVar65._12_4_;
          auVar9 = vsubps_avx(auVar9,auVar58);
          auVar47 = vsubps_avx(auVar47,auVar59);
          fVar88 = auVar58._0_4_ + fVar64;
          fVar113 = auVar58._4_4_ + fVar71;
          fVar120 = auVar58._8_4_ + fVar72;
          fVar121 = auVar58._12_4_ + fVar73;
          fVar122 = fVar143 + auVar59._0_4_;
          fVar83 = fVar145 + auVar59._4_4_;
          fVar86 = fVar146 + auVar59._8_4_;
          fVar89 = fVar147 + auVar59._12_4_;
          fVar55 = auVar47._0_4_;
          auVar144._0_4_ = fVar88 * fVar55;
          fVar75 = auVar47._4_4_;
          auVar144._4_4_ = fVar113 * fVar75;
          fVar82 = auVar47._8_4_;
          auVar144._8_4_ = fVar120 * fVar82;
          fVar85 = auVar47._12_4_;
          auVar144._12_4_ = fVar121 * fVar85;
          fVar123 = auVar9._0_4_;
          auVar65._0_4_ = fVar123 * fVar122;
          fVar127 = auVar9._4_4_;
          auVar65._4_4_ = fVar127 * fVar83;
          fVar128 = auVar9._8_4_;
          auVar65._8_4_ = fVar128 * fVar86;
          fVar129 = auVar9._12_4_;
          auVar65._12_4_ = fVar129 * fVar89;
          auVar9 = vsubps_avx(auVar65,auVar144);
          auVar42 = vsubps_avx(auVar42,auVar38);
          fVar135 = auVar42._0_4_;
          auVar79._0_4_ = fVar135 * fVar122;
          fVar136 = auVar42._4_4_;
          auVar79._4_4_ = fVar136 * fVar83;
          fVar137 = auVar42._8_4_;
          auVar79._8_4_ = fVar137 * fVar86;
          fVar138 = auVar42._12_4_;
          auVar79._12_4_ = fVar138 * fVar89;
          fVar122 = auVar38._0_4_ + fVar101;
          fVar83 = auVar38._4_4_ + fVar110;
          fVar86 = auVar38._8_4_ + fVar111;
          fVar89 = auVar38._12_4_ + fVar112;
          auVar116._0_4_ = fVar122 * fVar55;
          auVar116._4_4_ = fVar83 * fVar75;
          auVar116._8_4_ = fVar86 * fVar82;
          auVar116._12_4_ = fVar89 * fVar85;
          auVar42 = vsubps_avx(auVar116,auVar79);
          auVar102._0_4_ = fVar123 * fVar122;
          auVar102._4_4_ = fVar127 * fVar83;
          auVar102._8_4_ = fVar128 * fVar86;
          auVar102._12_4_ = fVar129 * fVar89;
          auVar47._0_4_ = fVar135 * fVar88;
          auVar47._4_4_ = fVar136 * fVar113;
          auVar47._8_4_ = fVar137 * fVar120;
          auVar47._12_4_ = fVar138 * fVar121;
          auVar47 = vsubps_avx(auVar47,auVar102);
          auVar126._0_4_ = fVar53 * auVar9._0_4_ + fVar43 * auVar47._0_4_ + fVar52 * auVar42._0_4_;
          auVar126._4_4_ = fVar53 * auVar9._4_4_ + fVar43 * auVar47._4_4_ + fVar52 * auVar42._4_4_;
          auVar126._8_4_ = fVar53 * auVar9._8_4_ + fVar43 * auVar47._8_4_ + fVar52 * auVar42._8_4_;
          auVar126._12_4_ =
               fVar53 * auVar9._12_4_ + fVar43 * auVar47._12_4_ + fVar52 * auVar42._12_4_;
          auVar42 = vsubps_avx(auVar38,auVar45);
          fVar83 = auVar38._0_4_ + auVar45._0_4_;
          fVar86 = auVar38._4_4_ + auVar45._4_4_;
          fVar89 = auVar38._8_4_ + auVar45._8_4_;
          fVar74 = auVar38._12_4_ + auVar45._12_4_;
          auVar9 = vsubps_avx(auVar58,auVar57);
          fVar91 = auVar58._0_4_ + auVar57._0_4_;
          fVar95 = auVar58._4_4_ + auVar57._4_4_;
          fVar96 = auVar58._8_4_ + auVar57._8_4_;
          fVar97 = auVar58._12_4_ + auVar57._12_4_;
          auVar47 = vsubps_avx(auVar59,auVar66);
          fVar113 = auVar59._0_4_ + auVar66._0_4_;
          fVar120 = auVar59._4_4_ + auVar66._4_4_;
          fVar121 = auVar59._8_4_ + auVar66._8_4_;
          fVar122 = auVar59._12_4_ + auVar66._12_4_;
          fVar139 = auVar47._0_4_;
          auVar103._0_4_ = fVar139 * fVar91;
          fVar140 = auVar47._4_4_;
          auVar103._4_4_ = fVar140 * fVar95;
          fVar141 = auVar47._8_4_;
          auVar103._8_4_ = fVar141 * fVar96;
          fVar142 = auVar47._12_4_;
          auVar103._12_4_ = fVar142 * fVar97;
          fVar76 = auVar9._0_4_;
          auVar117._0_4_ = fVar76 * fVar113;
          fVar84 = auVar9._4_4_;
          auVar117._4_4_ = fVar84 * fVar120;
          fVar87 = auVar9._8_4_;
          auVar117._8_4_ = fVar87 * fVar121;
          fVar90 = auVar9._12_4_;
          auVar117._12_4_ = fVar90 * fVar122;
          auVar9 = vsubps_avx(auVar117,auVar103);
          fVar88 = auVar42._0_4_;
          auVar58._0_4_ = fVar88 * fVar113;
          fVar113 = auVar42._4_4_;
          auVar58._4_4_ = fVar113 * fVar120;
          fVar120 = auVar42._8_4_;
          auVar58._8_4_ = fVar120 * fVar121;
          fVar121 = auVar42._12_4_;
          auVar58._12_4_ = fVar121 * fVar122;
          auVar118._0_4_ = fVar139 * fVar83;
          auVar118._4_4_ = fVar140 * fVar86;
          auVar118._8_4_ = fVar141 * fVar89;
          auVar118._12_4_ = fVar142 * fVar74;
          auVar42 = vsubps_avx(auVar118,auVar58);
          auVar66._0_4_ = fVar83 * fVar76;
          auVar66._4_4_ = fVar86 * fVar84;
          auVar66._8_4_ = fVar89 * fVar87;
          auVar66._12_4_ = fVar74 * fVar90;
          auVar92._0_4_ = fVar88 * fVar91;
          auVar92._4_4_ = fVar113 * fVar95;
          auVar92._8_4_ = fVar120 * fVar96;
          auVar92._12_4_ = fVar121 * fVar97;
          auVar47 = vsubps_avx(auVar92,auVar66);
          auVar59._0_4_ = fVar53 * auVar9._0_4_ + fVar43 * auVar47._0_4_ + fVar52 * auVar42._0_4_;
          auVar59._4_4_ = fVar53 * auVar9._4_4_ + fVar43 * auVar47._4_4_ + fVar52 * auVar42._4_4_;
          auVar59._8_4_ = fVar53 * auVar9._8_4_ + fVar43 * auVar47._8_4_ + fVar52 * auVar42._8_4_;
          auVar59._12_4_ =
               fVar53 * auVar9._12_4_ + fVar43 * auVar47._12_4_ + fVar52 * auVar42._12_4_;
          auVar38._0_4_ = auVar59._0_4_ + auVar126._0_4_ + auVar131._0_4_;
          auVar38._4_4_ = auVar59._4_4_ + auVar126._4_4_ + auVar131._4_4_;
          auVar38._8_4_ = auVar59._8_4_ + auVar126._8_4_ + auVar131._8_4_;
          auVar38._12_4_ = auVar59._12_4_ + auVar126._12_4_ + auVar131._12_4_;
          auVar42 = vminps_avx(auVar131,auVar126);
          auVar9 = vminps_avx(auVar42,auVar59);
          auVar42._8_4_ = 0x7fffffff;
          auVar42._0_8_ = 0x7fffffff7fffffff;
          auVar42._12_4_ = 0x7fffffff;
          auVar42 = vandps_avx(auVar38,auVar42);
          auVar93._0_4_ = auVar42._0_4_ * 1.1920929e-07;
          auVar93._4_4_ = auVar42._4_4_ * 1.1920929e-07;
          auVar93._8_4_ = auVar42._8_4_ * 1.1920929e-07;
          auVar93._12_4_ = auVar42._12_4_ * 1.1920929e-07;
          uVar25 = CONCAT44(auVar93._4_4_,auVar93._0_4_);
          auVar104._0_8_ = uVar25 ^ 0x8000000080000000;
          auVar104._8_4_ = -auVar93._8_4_;
          auVar104._12_4_ = -auVar93._12_4_;
          auVar9 = vcmpps_avx(auVar9,auVar104,5);
          auVar47 = vmaxps_avx(auVar131,auVar126);
          auVar47 = vmaxps_avx(auVar47,auVar59);
          auVar47 = vcmpps_avx(auVar47,auVar93,2);
          auVar9 = vorps_avx(auVar9,auVar47);
          if ((((auVar9 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar9 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar9[0xf] < '\0') {
            auVar60._0_4_ = fVar123 * fVar44;
            auVar60._4_4_ = fVar127 * fVar54;
            auVar60._8_4_ = fVar128 * fVar56;
            auVar60._12_4_ = fVar129 * fVar8;
            auVar67._0_4_ = fVar55 * fVar148;
            auVar67._4_4_ = fVar75 * fVar149;
            auVar67._8_4_ = fVar82 * fVar150;
            auVar67._12_4_ = fVar85 * fVar151;
            auVar59 = vsubps_avx(auVar67,auVar60);
            auVar94._0_4_ = fVar55 * fVar76;
            auVar94._4_4_ = fVar75 * fVar84;
            auVar94._8_4_ = fVar82 * fVar87;
            auVar94._12_4_ = fVar85 * fVar90;
            auVar105._0_4_ = fVar123 * fVar139;
            auVar105._4_4_ = fVar127 * fVar140;
            auVar105._8_4_ = fVar128 * fVar141;
            auVar105._12_4_ = fVar129 * fVar142;
            auVar45 = vsubps_avx(auVar105,auVar94);
            auVar80._8_4_ = 0x7fffffff;
            auVar80._0_8_ = 0x7fffffff7fffffff;
            auVar80._12_4_ = 0x7fffffff;
            auVar47 = vandps_avx(auVar60,auVar80);
            auVar58 = vandps_avx(auVar94,auVar80);
            auVar47 = vcmpps_avx(auVar47,auVar58,1);
            local_13b8 = vblendvps_avx(auVar45,auVar59,auVar47);
            auVar61._0_4_ = fVar135 * fVar139;
            auVar61._4_4_ = fVar136 * fVar140;
            auVar61._8_4_ = fVar137 * fVar141;
            auVar61._12_4_ = fVar138 * fVar142;
            auVar68._0_4_ = fVar135 * fVar44;
            auVar68._4_4_ = fVar136 * fVar54;
            auVar68._8_4_ = fVar137 * fVar56;
            auVar68._12_4_ = fVar138 * fVar8;
            auVar98._0_4_ = fVar55 * fVar130;
            auVar98._4_4_ = fVar75 * fVar132;
            auVar98._8_4_ = fVar82 * fVar133;
            auVar98._12_4_ = fVar85 * fVar134;
            auVar59 = vsubps_avx(auVar68,auVar98);
            auVar106._0_4_ = fVar55 * fVar88;
            auVar106._4_4_ = fVar75 * fVar113;
            auVar106._8_4_ = fVar82 * fVar120;
            auVar106._12_4_ = fVar85 * fVar121;
            auVar45 = vsubps_avx(auVar106,auVar61);
            auVar47 = vandps_avx(auVar98,auVar80);
            auVar58 = vandps_avx(auVar61,auVar80);
            auVar47 = vcmpps_avx(auVar47,auVar58,1);
            local_13a8 = vblendvps_avx(auVar45,auVar59,auVar47);
            auVar48._0_4_ = fVar123 * fVar88;
            auVar48._4_4_ = fVar127 * fVar113;
            auVar48._8_4_ = fVar128 * fVar120;
            auVar48._12_4_ = fVar129 * fVar121;
            auVar69._0_4_ = fVar123 * fVar130;
            auVar69._4_4_ = fVar127 * fVar132;
            auVar69._8_4_ = fVar128 * fVar133;
            auVar69._12_4_ = fVar129 * fVar134;
            auVar99._0_4_ = fVar135 * fVar148;
            auVar99._4_4_ = fVar136 * fVar149;
            auVar99._8_4_ = fVar137 * fVar150;
            auVar99._12_4_ = fVar138 * fVar151;
            auVar39._0_4_ = fVar135 * fVar76;
            auVar39._4_4_ = fVar136 * fVar84;
            auVar39._8_4_ = fVar137 * fVar87;
            auVar39._12_4_ = fVar138 * fVar90;
            auVar59 = vsubps_avx(auVar69,auVar99);
            auVar45 = vsubps_avx(auVar39,auVar48);
            auVar47 = vandps_avx(auVar99,auVar80);
            auVar58 = vandps_avx(auVar48,auVar80);
            auVar47 = vcmpps_avx(auVar47,auVar58,1);
            local_1398 = vblendvps_avx(auVar45,auVar59,auVar47);
            fVar44 = local_13b8._0_4_ * fVar53 +
                     local_1398._0_4_ * fVar43 + local_13a8._0_4_ * fVar52;
            fVar55 = local_13b8._4_4_ * fVar53 +
                     local_1398._4_4_ * fVar43 + local_13a8._4_4_ * fVar52;
            fVar54 = local_13b8._8_4_ * fVar53 +
                     local_1398._8_4_ * fVar43 + local_13a8._8_4_ * fVar52;
            fVar43 = local_13b8._12_4_ * fVar53 +
                     local_1398._12_4_ * fVar43 + local_13a8._12_4_ * fVar52;
            auVar100._0_4_ = fVar44 + fVar44;
            auVar100._4_4_ = fVar55 + fVar55;
            auVar100._8_4_ = fVar54 + fVar54;
            auVar100._12_4_ = fVar43 + fVar43;
            fVar55 = local_13b8._0_4_ * fVar101 +
                     local_1398._0_4_ * fVar143 + local_13a8._0_4_ * fVar64;
            fVar54 = local_13b8._4_4_ * fVar110 +
                     local_1398._4_4_ * fVar145 + local_13a8._4_4_ * fVar71;
            fVar75 = local_13b8._8_4_ * fVar111 +
                     local_1398._8_4_ * fVar146 + local_13a8._8_4_ * fVar72;
            fVar56 = local_13b8._12_4_ * fVar112 +
                     local_1398._12_4_ * fVar147 + local_13a8._12_4_ * fVar73;
            auVar47 = vrcpps_avx(auVar100);
            fVar43 = auVar47._0_4_;
            auVar107._0_4_ = auVar100._0_4_ * fVar43;
            fVar52 = auVar47._4_4_;
            auVar107._4_4_ = auVar100._4_4_ * fVar52;
            fVar53 = auVar47._8_4_;
            auVar107._8_4_ = auVar100._8_4_ * fVar53;
            fVar44 = auVar47._12_4_;
            auVar107._12_4_ = auVar100._12_4_ * fVar44;
            auVar81._8_4_ = 0x3f800000;
            auVar81._0_8_ = &DAT_3f8000003f800000;
            auVar81._12_4_ = 0x3f800000;
            auVar47 = vsubps_avx(auVar81,auVar107);
            local_13c8._0_4_ = (fVar55 + fVar55) * (fVar43 + fVar43 * auVar47._0_4_);
            local_13c8._4_4_ = (fVar54 + fVar54) * (fVar52 + fVar52 * auVar47._4_4_);
            local_13c8._8_4_ = (fVar75 + fVar75) * (fVar53 + fVar53 * auVar47._8_4_);
            local_13c8._12_4_ = (fVar56 + fVar56) * (fVar44 + fVar44 * auVar47._12_4_);
            uVar33 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar70._4_4_ = uVar33;
            auVar70._0_4_ = uVar33;
            auVar70._8_4_ = uVar33;
            auVar70._12_4_ = uVar33;
            auVar47 = vcmpps_avx(auVar70,local_13c8,2);
            uVar33 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar108._4_4_ = uVar33;
            auVar108._0_4_ = uVar33;
            auVar108._8_4_ = uVar33;
            auVar108._12_4_ = uVar33;
            auVar58 = vcmpps_avx(local_13c8,auVar108,2);
            auVar47 = vandps_avx(auVar58,auVar47);
            auVar58 = auVar9 & auVar47;
            if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar58[0xf] < '\0') {
              auVar9 = vandps_avx(auVar9,auVar47);
              auVar47 = vcmpps_avx(auVar100,_DAT_01feba10,4);
              auVar58 = auVar47 & auVar9;
              if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar58[0xf] < '\0') {
                auVar9 = vandps_avx(auVar9,auVar47);
                pSVar5 = context->scene;
                auVar47 = vrcpps_avx(auVar38);
                fVar43 = auVar47._0_4_;
                auVar49._0_4_ = auVar38._0_4_ * fVar43;
                fVar52 = auVar47._4_4_;
                auVar49._4_4_ = auVar38._4_4_ * fVar52;
                fVar53 = auVar47._8_4_;
                auVar49._8_4_ = auVar38._8_4_ * fVar53;
                fVar44 = auVar47._12_4_;
                auVar49._12_4_ = auVar38._12_4_ * fVar44;
                auVar62._8_4_ = 0x3f800000;
                auVar62._0_8_ = &DAT_3f8000003f800000;
                auVar62._12_4_ = 0x3f800000;
                auVar47 = vsubps_avx(auVar62,auVar49);
                auVar40._0_4_ = fVar43 + fVar43 * auVar47._0_4_;
                auVar40._4_4_ = fVar52 + fVar52 * auVar47._4_4_;
                auVar40._8_4_ = fVar53 + fVar53 * auVar47._8_4_;
                auVar40._12_4_ = fVar44 + fVar44 * auVar47._12_4_;
                auVar50._8_4_ = 0x219392ef;
                auVar50._0_8_ = 0x219392ef219392ef;
                auVar50._12_4_ = 0x219392ef;
                auVar42 = vcmpps_avx(auVar42,auVar50,5);
                auVar42 = vandps_avx(auVar42,auVar40);
                auVar51._0_4_ = auVar131._0_4_ * auVar42._0_4_;
                auVar51._4_4_ = auVar131._4_4_ * auVar42._4_4_;
                auVar51._8_4_ = auVar131._8_4_ * auVar42._8_4_;
                auVar51._12_4_ = auVar131._12_4_ * auVar42._12_4_;
                local_13e8 = vminps_avx(auVar51,auVar62);
                auVar41._0_4_ = auVar126._0_4_ * auVar42._0_4_;
                auVar41._4_4_ = auVar126._4_4_ * auVar42._4_4_;
                auVar41._8_4_ = auVar126._8_4_ * auVar42._8_4_;
                auVar41._12_4_ = auVar126._12_4_ * auVar42._12_4_;
                local_13d8 = vminps_avx(auVar41,auVar62);
                uVar33 = vmovmskps_avx(auVar9);
                uVar27 = CONCAT44((int)(uVar27 >> 0x20),uVar33);
                do {
                  uVar25 = 0;
                  if (uVar27 != 0) {
                    for (; (uVar27 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  uVar4 = *(uint *)(lVar26 + uVar28 + 0x90 + uVar25 * 4);
                  pGVar6 = (pSVar5->geometries).items[uVar4].ptr;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar27 = uVar27 ^ 1L << (uVar25 & 0x3f);
                    bVar37 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar37 = false;
                  }
                  else {
                    uVar33 = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar2 = *(undefined4 *)(local_13e8 + uVar25 * 4);
                    local_1358._4_4_ = uVar2;
                    local_1358._0_4_ = uVar2;
                    local_1358._8_4_ = uVar2;
                    local_1358._12_4_ = uVar2;
                    uVar2 = *(undefined4 *)(local_13d8 + uVar25 * 4);
                    local_1348._4_4_ = uVar2;
                    local_1348._0_4_ = uVar2;
                    local_1348._8_4_ = uVar2;
                    local_1348._12_4_ = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_13c8 + uVar25 * 4);
                    args.context = context->user;
                    local_1328 = vpshufd_avx(ZEXT416(uVar4),0);
                    uVar2 = *(undefined4 *)(lVar26 + uVar28 + 0xa0 + uVar25 * 4);
                    local_1338._4_4_ = uVar2;
                    local_1338._0_4_ = uVar2;
                    local_1338._8_4_ = uVar2;
                    local_1338._12_4_ = uVar2;
                    uVar2 = *(undefined4 *)(local_13b8 + uVar25 * 4);
                    uVar3 = *(undefined4 *)(local_13a8 + uVar25 * 4);
                    local_1378._4_4_ = uVar3;
                    local_1378._0_4_ = uVar3;
                    local_1378._8_4_ = uVar3;
                    local_1378._12_4_ = uVar3;
                    uVar3 = *(undefined4 *)(local_1398 + uVar25 * 4);
                    local_1368._4_4_ = uVar3;
                    local_1368._0_4_ = uVar3;
                    local_1368._8_4_ = uVar3;
                    local_1368._12_4_ = uVar3;
                    local_1388[0] = (RTCHitN)(char)uVar2;
                    local_1388[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1388[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1388[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1388[4] = (RTCHitN)(char)uVar2;
                    local_1388[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1388[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1388[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1388[8] = (RTCHitN)(char)uVar2;
                    local_1388[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1388[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1388[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1388[0xc] = (RTCHitN)(char)uVar2;
                    local_1388[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1388[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1388[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    vcmpps_avx(ZEXT1632(local_1328),ZEXT1632(local_1328),0xf);
                    uStack_1314 = (args.context)->instID[0];
                    local_1318 = uStack_1314;
                    uStack_1310 = uStack_1314;
                    uStack_130c = uStack_1314;
                    uStack_1308 = (args.context)->instPrimID[0];
                    uStack_1304 = uStack_1308;
                    uStack_1300 = uStack_1308;
                    uStack_12fc = uStack_1308;
                    local_15b8 = *local_15a8;
                    uStack_15b0 = local_15a8[1];
                    args.valid = (int *)&local_15b8;
                    args.geometryUserPtr = pGVar6->userPtr;
                    args.hit = local_1388;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar6->occlusionFilterN)(&args);
                    }
                    auVar9._8_8_ = uStack_15b0;
                    auVar9._0_8_ = local_15b8;
                    if (auVar9 == (undefined1  [16])0x0) {
                      auVar42 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar42 = auVar42 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var7)(&args);
                      }
                      auVar21._8_8_ = uStack_15b0;
                      auVar21._0_8_ = local_15b8;
                      auVar9 = vpcmpeqd_avx((undefined1  [16])0x0,auVar21);
                      auVar42 = auVar9 ^ _DAT_01febe20;
                      auVar63._8_4_ = 0xff800000;
                      auVar63._0_8_ = 0xff800000ff800000;
                      auVar63._12_4_ = 0xff800000;
                      auVar9 = vblendvps_avx(auVar63,*(undefined1 (*) [16])(args.ray + 0x80),auVar9)
                      ;
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar9;
                    }
                    auVar42 = vpslld_avx(auVar42,0x1f);
                    bVar19 = (auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar20 = (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar18 = (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar17 = -1 < auVar42[0xf];
                    bVar37 = ((bVar19 && bVar20) && bVar18) && bVar17;
                    if (((bVar19 && bVar20) && bVar18) && bVar17) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar33;
                      uVar27 = uVar27 ^ 1L << (uVar25 & 0x3f);
                    }
                  }
                  if (!bVar37) {
                    if (bVar36) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar35 = 1;
                    }
                    goto LAB_0043c8d3;
                  }
                } while (uVar27 != 0);
                uVar27 = 0;
              }
            }
          }
          local_1598 = local_1598 + 1;
          bVar36 = local_1598 < local_15a0;
        } while (local_1598 != local_15a0);
      }
    }
LAB_0043c8d3:
  } while ((uVar35 & 3) == 0);
  return local_1590 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }